

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

bool __thiscall
ON_Internal_ExtrudedEdge::SetSideGroupIdFromVertexPairs(ON_Internal_ExtrudedEdge *this)

{
  bool bVar1;
  uint local_1c;
  uint evi;
  ON_Internal_ExtrudedEdge *this_local;
  
  if (this->m_side_group_id == 0) {
    for (local_1c = 0; local_1c < 2; local_1c = local_1c + 1) {
      if ((this->m_extruded_vertex[local_1c] != (ON_Internal_ExtrudedVertex *)0x0) &&
         (this->m_extruded_vertex[local_1c]->m_side_group_id != 0)) {
        bVar1 = SetSideGroupId(this,this->m_extruded_vertex[local_1c]->m_side_group_id);
        return bVar1;
      }
    }
  }
  return false;
}

Assistant:

bool SetSideGroupIdFromVertexPairs()
  {
    if (m_side_group_id > 0)
      return false;
    for (unsigned evi = 0; evi < 2; ++evi)
    {
      if (nullptr != m_extruded_vertex[evi] && m_extruded_vertex[evi]->m_side_group_id > 0)
        return SetSideGroupId(m_extruded_vertex[evi]->m_side_group_id);
    }
    return false;
  }